

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O0

void __thiscall tcu::x11::XlibWindow::~XlibWindow(XlibWindow *this)

{
  Display *pDVar1;
  XlibWindow *this_local;
  
  (this->super_WindowBase)._vptr_WindowBase = (_func_int **)&PTR__XlibWindow_0169bb58;
  pDVar1 = XlibDisplay::getXDisplay(this->m_display);
  XDestroyWindow(pDVar1,this->m_window);
  if (this->m_colormap != 0) {
    pDVar1 = XlibDisplay::getXDisplay(this->m_display);
    XFreeColormap(pDVar1,this->m_colormap);
  }
  WindowBase::~WindowBase(&this->super_WindowBase);
  return;
}

Assistant:

XlibWindow::~XlibWindow (void)
{
	XDestroyWindow(m_display.getXDisplay(), m_window);
	if (m_colormap != None)
		XFreeColormap(m_display.getXDisplay(), m_colormap);
}